

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_31a509::Handlers::beginEncrypt(Handlers *this,JSON *j)

{
  element_type *__block;
  shared_ptr<QPDFJob::EncConfig> local_128;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  anon_class_48_6_b9cc9afa local_b8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  local_88;
  bool local_62;
  bool local_61;
  undefined1 local_60 [6];
  bool owner_password_seen;
  bool user_password_seen;
  string owner_password;
  string user_password;
  int key_len;
  JSON *j_local;
  Handlers *this_local;
  
  user_password.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(owner_password.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  local_61 = false;
  local_62 = false;
  local_b8.key_len = (int *)((long)&user_password.field_2 + 0xc);
  local_b8.user_password_seen = &local_61;
  local_b8.owner_password_seen = &local_62;
  local_b8.this = this;
  local_b8.user_password = (string *)(owner_password.field_2._M_local_buf + 8);
  local_b8.owner_password = (string *)local_60;
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<(anonymous_namespace)::Handlers::beginEncrypt(JSON)::__0,void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_88,&local_b8);
  JSON::forEachDictItem(j,&local_88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_88);
  if (user_password.field_2._12_4_ == 0) {
    QTC::TC("qpdf","QPDFJob json encrypt no key length",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be supplied for one of them to set the key length without imposing any restrictions"
               ,&local_e9);
    usage(this,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  if (((local_61 & 1U) == 0) || ((local_62 & 1U) == 0)) {
    QTC::TC("qpdf","QPDFJob json encrypt missing password",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "the user and owner password are both required; use the empty string for the user password if you don\'t want a password"
               ,&local_111);
    usage(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  __block = std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->c_main);
  QPDFJob::Config::encrypt((Config *)&local_128,(char *)__block,user_password.field_2._12_4_);
  std::shared_ptr<QPDFJob::EncConfig>::operator=(&this->c_enc,&local_128);
  std::shared_ptr<QPDFJob::EncConfig>::~shared_ptr(&local_128);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(owner_password.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
Handlers::beginEncrypt(JSON j)
{
    // This method is only called if the overall JSON structure matches the schema, so we already
    // know that keys that are present have the right types.
    int key_len = 0;
    std::string user_password;
    std::string owner_password;
    bool user_password_seen = false;
    bool owner_password_seen = false;
    j.forEachDictItem([&](std::string const& key, JSON value) {
        if ((key == "40bit") || (key == "128bit") || (key == "256bit")) {
            if (key_len != 0) {
                QTC::TC("qpdf", "QPDFJob json encrypt duplicate key length");
                usage("exactly one of 40bit, 128bit, or 256bit must be given");
            }
            key_len = QUtil::string_to_int(key.c_str());
        } else if (key == "userPassword") {
            user_password_seen = value.getString(user_password);
        } else if (key == "ownerPassword") {
            owner_password_seen = value.getString(owner_password);
        }
    });
    if (key_len == 0) {
        QTC::TC("qpdf", "QPDFJob json encrypt no key length");
        usage(
            "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be "
            "supplied for one of them to set the key length without imposing any restrictions");
    }
    if (!(user_password_seen && owner_password_seen)) {
        QTC::TC("qpdf", "QPDFJob json encrypt missing password");
        usage(
            "the user and owner password are both required; use the empty string for the user "
            "password if you don't want a password");
    }
    this->c_enc = c_main->encrypt(key_len, user_password, owner_password);
}